

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.hpp
# Opt level: O0

void bits::rand_keys(mt19937_64 *rnd64,uint64_t *keys,uint32_t *indices,uint64_t *copy,uint32_t size
                    )

{
  result_type rVar1;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_R8D;
  uint32_t i;
  uint local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(in_RCX);
    *(result_type *)(in_RSI + (ulong)local_28 * 8) = rVar1;
    in_RCX->_M_x[local_28] = *(unsigned_long *)(in_RSI + (ulong)local_28 * 8);
    *(uint *)(in_RDX + (ulong)local_28 * 4) = local_28;
  }
  return;
}

Assistant:

inline void rand_keys(
    std::mt19937_64& rnd64, uint64_t* keys, uint32_t* indices, uint64_t* copy, uint32_t size)
{
    for (uint32_t i = 0; i < size; ++i)
    {
        keys[i] = rnd64();
        copy[i] = keys[i];
        indices[i] = i;
    }
}